

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_two_connects.c
# Opt level: O3

void server_handle_read(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                       cio_read_buffer *read_buffer,size_t num_bytes)

{
  cio_error cVar1;
  
  if (err == CIO_SUCCESS) {
    read_buffer->fetch_ptr = read_buffer->fetch_ptr + num_bytes;
    cVar1 = cio_buffered_stream_read_at_least
                      (buffered_stream,(cio_read_buffer *)((long)handler_context + 0x1c0),6,
                       server_handle_read,handler_context);
    if (cVar1 == CIO_SUCCESS) {
      return;
    }
    server_handle_read_cold_1();
  }
  else if (err == CIO_EOF) {
    fwrite("connection closed by client peer\n",0x21,1,_stdout);
  }
  else {
    server_handle_read_cold_2();
  }
  cio_buffered_stream_close(buffered_stream);
  return;
}

Assistant:

static void server_handle_read(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *read_buffer, size_t num_bytes)
{
	(void)read_buffer;
	(void)num_bytes;

	struct echo_client *client = handler_context;

	if (cio_unlikely(err == CIO_EOF)) {
		(void)fprintf(stdout, "connection closed by client peer\n");
		cio_buffered_stream_close(buffered_stream);
		return;
	}

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "read error!\n");
		cio_buffered_stream_close(buffered_stream);
		return;
	}

	cio_read_buffer_consume(read_buffer, num_bytes);
	err = cio_buffered_stream_read_at_least(buffered_stream, &client->rb, sizeof(HELLO), server_handle_read, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "server could no start reading!\n");
		cio_buffered_stream_close(buffered_stream);
		return;
	}
}